

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O1

int populate_gost_engine(ENGINE *e)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  ASN1_OBJECT *obj;
  char **ppcVar4;
  long lVar5;
  
  if (e != (ENGINE *)0x0) {
    iVar2 = ENGINE_set_id((ENGINE *)e,"gost");
    if (iVar2 == 0) {
      populate_gost_engine_cold_9();
    }
    else {
      iVar2 = ENGINE_set_name((ENGINE *)e,"Reference implementation of GOST engine");
      if (iVar2 == 0) {
        populate_gost_engine_cold_8();
      }
      else {
        iVar2 = OBJ_new_nid(2);
        lVar5 = 0;
        do {
          puVar1 = *(undefined8 **)((long)missing_NIDs + lVar5);
          obj = ASN1_OBJECT_create(iVar2,(uchar *)0x0,0,(char *)*puVar1,(char *)puVar1[1]);
          puVar1[3] = obj;
          if ((obj == (ASN1_OBJECT *)0x0) || (iVar3 = OBJ_add_object(obj), iVar3 == 0)) {
            populate_gost_engine_cold_7();
            return 0;
          }
          (*(code *)puVar1[2])(iVar2);
          iVar2 = iVar2 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar5 == 8);
        iVar2 = ENGINE_set_digests((ENGINE *)e,gost_digests);
        if (iVar2 == 0) {
          populate_gost_engine_cold_6();
        }
        else {
          iVar2 = ENGINE_set_ciphers((ENGINE *)e,gost_ciphers);
          if (iVar2 == 0) {
            populate_gost_engine_cold_5();
          }
          else {
            iVar2 = ENGINE_set_pkey_meths((ENGINE *)e,gost_pkey_meths);
            if (iVar2 == 0) {
              populate_gost_engine_cold_4();
            }
            else {
              iVar2 = ENGINE_set_pkey_asn1_meths((ENGINE *)e,gost_pkey_asn1_meths);
              if (iVar2 == 0) {
                populate_gost_engine_cold_3();
              }
              else {
                iVar2 = ENGINE_set_cmd_defns((ENGINE *)e,(ENGINE_CMD_DEFN *)gost_cmds);
                if (iVar2 == 0) {
                  populate_gost_engine_cold_2();
                }
                else {
                  iVar2 = ENGINE_set_ctrl_function((ENGINE *)e,gost_control_func);
                  if (iVar2 == 0) {
                    populate_gost_engine_cold_1();
                  }
                  else {
                    iVar2 = ENGINE_set_destroy_function((ENGINE *)e,gost_engine_destroy);
                    if (((iVar2 != 0) &&
                        (iVar2 = ENGINE_set_init_function((ENGINE *)e,gost_engine_init), iVar2 != 0)
                        ) && (iVar2 = ENGINE_set_finish_function((ENGINE *)e,gost_engine_finish),
                             iVar2 != 0)) {
                      ppcVar4 = &gost_meth_array[0].info;
                      do {
                        iVar2 = ((gost_meth_minfo *)(ppcVar4 + -4))->nid;
                        if (iVar2 != 0x497) {
                          if (iVar2 == 0) {
                            return 1;
                          }
                          iVar3 = register_ameth_gost(iVar2,(EVP_PKEY_ASN1_METHOD **)ppcVar4[-2],
                                                      ppcVar4[-1],*ppcVar4);
                          if (iVar3 == 0) {
                            return 0;
                          }
                          iVar2 = register_pmeth_gost(iVar2,(EVP_PKEY_METHOD **)ppcVar4[-3],0);
                          if (iVar2 == 0) {
                            return 0;
                          }
                        }
                        ppcVar4 = ppcVar4 + 5;
                      } while( true );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int populate_gost_engine(ENGINE* e) {
    int ret = 0;

    if (e == NULL)
        goto end;
    if (!ENGINE_set_id(e, engine_gost_id)) {
        fprintf(stderr, "ENGINE_set_id failed\n");
        goto end;
    }
    if (!ENGINE_set_name(e, engine_gost_name)) {
        fprintf(stderr, "ENGINE_set_name failed\n");
        goto end;
    }
    if (!create_NIDs()) {
        fprintf(stderr, "NID creation failed\n");
        goto end;
    }
    if (!ENGINE_set_digests(e, gost_digests)) {
        fprintf(stderr, "ENGINE_set_digests failed\n");
        goto end;
    }
    if (!ENGINE_set_ciphers(e, gost_ciphers)) {
        fprintf(stderr, "ENGINE_set_ciphers failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_meths(e, gost_pkey_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_meths failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_asn1_meths(e, gost_pkey_asn1_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_asn1_meths failed\n");
        goto end;
    }
    /* Control function and commands */
    if (!ENGINE_set_cmd_defns(e, gost_cmds)) {
        fprintf(stderr, "ENGINE_set_cmd_defns failed\n");
        goto end;
    }
    if (!ENGINE_set_ctrl_function(e, gost_control_func)) {
        fprintf(stderr, "ENGINE_set_ctrl_func failed\n");
        goto end;
    }
    if (!ENGINE_set_destroy_function(e, gost_engine_destroy)
        || !ENGINE_set_init_function(e, gost_engine_init)
        || !ENGINE_set_finish_function(e, gost_engine_finish)) {
        goto end;
    }

    /*
     * "register" in "register_ameth_gost" and "register_pmeth_gost" is
     * not registering in an ENGINE sense, where things are hooked into
     * OpenSSL's library.  "register_ameth_gost" and "register_pmeth_gost"
     * merely allocate and populate the method structures of this engine.
     */
    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {

        /* This skip looks temporary. */
        if (minfo->nid == NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac)
            continue;

        if (!register_ameth_gost(minfo->nid, minfo->ameth, minfo->pemstr,
                minfo->info))
            goto end;
        if (!register_pmeth_gost(minfo->nid, minfo->pmeth, 0))
            goto end;
    }

    ret = 1;
  end:
    return ret;
}